

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O1

void __thiscall QGuiApplicationPrivate::notifyWindowIconChanged(QGuiApplicationPrivate *this)

{
  undefined1 *puVar1;
  long in_FS_OFFSET;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_28,ApplicationWindowIconChange);
  QGuiApplication::topLevelWindows();
  puVar1 = (undefined1 *)0x0;
  do {
    QCoreApplication::sendEvent
              (*(QObject **)(&DAT_aaaaaaaaaaaaaaaa + (long)puVar1 * 8),(QEvent *)&local_28);
    puVar1 = puVar1 + 1;
  } while (puVar1 < &DAT_aaaaaaaaaaaaaaaa);
  LOCK();
  _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
  UNLOCK();
  if (_DAT_aaaaaaaaaaaaaaaa == 0) {
    QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,8,0x10);
  }
  QEvent::~QEvent((QEvent *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGuiApplicationPrivate::notifyWindowIconChanged()
{
    QEvent ev(QEvent::ApplicationWindowIconChange);
    const QWindowList list = QGuiApplication::topLevelWindows();
    for (int i = 0; i < list.size(); ++i)
        QCoreApplication::sendEvent(list.at(i), &ev);
}